

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitVAArgumentExpression(SyntaxDumper *this,VAArgumentExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  TypeNameSyntax *pTVar2;
  VAArgumentExpressionSyntax local_108 [56];
  VAArgumentExpressionSyntax local_d0 [56];
  VAArgumentExpressionSyntax local_98 [72];
  VAArgumentExpressionSyntax local_50 [56];
  VAArgumentExpressionSyntax *local_18;
  VAArgumentExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (VAArgumentExpressionSyntax *)this;
  VAArgumentExpressionSyntax::keyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  VAArgumentExpressionSyntax::openParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar1 = VAArgumentExpressionSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  VAArgumentExpressionSyntax::commaToken(local_d0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_d0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_d0);
  pTVar2 = VAArgumentExpressionSyntax::typeName(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pTVar2);
  VAArgumentExpressionSyntax::closeParenthesisToken(local_108);
  (**(code **)(*(long *)this + 0x2e8))(this,local_108,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_108);
  return Skip;
}

Assistant:

virtual Action visitVAArgumentExpression(const VAArgumentExpressionSyntax* node) override
    {
        terminal(node->keyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->commaToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }